

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadersConfig.h
# Opt level: O2

HeadersConfig *
jaegertracing::propagation::HeadersConfig::parse
          (HeadersConfig *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  char (*in_R8) [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> traceBaggageHeaderPrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> traceContextHeaderName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> jaegerBaggageHeader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> jaegerDebugHeader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = YAML::Node::IsDefined(configYAML);
  if ((bVar1) && (bVar1 = YAML::Node::IsMap(configYAML), bVar1)) {
    utils::yaml::findOrDefault<std::__cxx11::string,char[18],char[1]>
              (&local_38,(yaml *)configYAML,(Node *)"jaegerDebugHeader",(char (*) [18])0x253b49,
               in_R8);
    utils::yaml::findOrDefault<std::__cxx11::string,char[20],char[1]>
              (&local_58,(yaml *)configYAML,(Node *)"jaegerBaggageHeader",(char (*) [20])0x253b49,
               in_R8);
    utils::yaml::findOrDefault<std::__cxx11::string,char[23],char[1]>
              (&local_78,(yaml *)configYAML,(Node *)"TraceContextHeaderName",(char (*) [23])0x253b49
               ,in_R8);
    utils::yaml::findOrDefault<std::__cxx11::string,char[25],char[1]>
              (&bStack_98,(yaml *)configYAML,(Node *)"traceBaggageHeaderPrefix",
               (char (*) [25])0x253b49,in_R8);
    HeadersConfig(__return_storage_ptr__,&local_38,&local_58,&local_78,&bStack_98);
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  }
  HeadersConfig(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static HeadersConfig parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return HeadersConfig();
        }

        const auto jaegerDebugHeader = utils::yaml::findOrDefault<std::string>(
            configYAML, "jaegerDebugHeader", "");
        const auto jaegerBaggageHeader =
            utils::yaml::findOrDefault<std::string>(
                configYAML, "jaegerBaggageHeader", "");
        const auto traceContextHeaderName =
            utils::yaml::findOrDefault<std::string>(
                configYAML, "TraceContextHeaderName", "");
        const auto traceBaggageHeaderPrefix =
            utils::yaml::findOrDefault<std::string>(
                configYAML, "traceBaggageHeaderPrefix", "");

        return HeadersConfig(jaegerDebugHeader,
                             jaegerBaggageHeader,
                             traceContextHeaderName,
                             traceBaggageHeaderPrefix);
    }